

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O0

uint32_t duckdb_brotli::BrotliBuildSimpleHuffmanTable
                   (HuffmanCode *table,int root_bits,uint16_t *val,uint32_t num_symbols)

{
  ushort uVar1;
  uint32_t uVar2;
  undefined4 in_ECX;
  ushort *in_RDX;
  byte in_SIL;
  uint *in_RDI;
  uint16_t t_1;
  uint16_t t;
  int k;
  int i;
  uint32_t goal_size;
  uint32_t table_size;
  HuffmanCode h_22;
  HuffmanCode h_21;
  HuffmanCode h_20;
  HuffmanCode h_19;
  HuffmanCode h_18;
  HuffmanCode h_17;
  HuffmanCode h_16;
  HuffmanCode h_15;
  HuffmanCode h_14;
  HuffmanCode h_13;
  HuffmanCode h_12;
  HuffmanCode h_11;
  HuffmanCode h_10;
  HuffmanCode h_9;
  HuffmanCode h_8;
  HuffmanCode h_7;
  HuffmanCode h_6;
  HuffmanCode h_5;
  HuffmanCode h_4;
  HuffmanCode h_3;
  HuffmanCode h_2;
  HuffmanCode h_1;
  HuffmanCode h;
  int local_110;
  int local_10c;
  uint local_d8;
  undefined4 local_b4;
  undefined4 local_ac;
  undefined4 local_a4;
  undefined4 local_9c;
  undefined4 local_94;
  undefined4 local_8c;
  undefined4 local_84;
  undefined4 local_7c;
  undefined4 local_74;
  undefined4 local_6c;
  undefined4 local_64;
  undefined4 local_5c;
  undefined4 local_54;
  undefined4 local_4c;
  undefined4 local_44;
  undefined4 local_3c;
  undefined4 local_34;
  undefined4 local_2c;
  undefined4 local_24;
  undefined4 local_1c;
  undefined4 local_14;
  undefined4 local_c;
  uint local_4;
  
  local_d8 = 1;
  uVar2 = 1 << (in_SIL & 0x1f);
  switch(in_ECX) {
  case 0:
    local_4 = CONCAT22(*in_RDX,(undefined2)local_4) & 0xffffff00;
    *in_RDI = local_4;
    break;
  case 1:
    if (*in_RDX < in_RDX[1]) {
      local_c = CONCAT31(local_c._1_3_,1);
      local_c = CONCAT22(*in_RDX,(undefined2)local_c);
      *in_RDI = local_c;
      local_14 = CONCAT31(local_14._1_3_,1);
      local_14 = CONCAT22(in_RDX[1],(undefined2)local_14);
      in_RDI[1] = local_14;
    }
    else {
      local_1c = CONCAT31(local_1c._1_3_,1);
      local_1c = CONCAT22(in_RDX[1],(undefined2)local_1c);
      *in_RDI = local_1c;
      local_24 = CONCAT31(local_24._1_3_,1);
      local_24 = CONCAT22(*in_RDX,(undefined2)local_24);
      in_RDI[1] = local_24;
    }
    local_d8 = 2;
    break;
  case 2:
    local_2c = CONCAT31(local_2c._1_3_,1);
    local_2c = CONCAT22(*in_RDX,(undefined2)local_2c);
    *in_RDI = local_2c;
    local_34 = CONCAT31(local_34._1_3_,1);
    local_34 = CONCAT22(*in_RDX,(undefined2)local_34);
    in_RDI[2] = local_34;
    if (in_RDX[1] < in_RDX[2]) {
      local_3c = CONCAT31(local_3c._1_3_,2);
      local_3c = CONCAT22(in_RDX[1],(undefined2)local_3c);
      in_RDI[1] = local_3c;
      local_44 = CONCAT31(local_44._1_3_,2);
      local_44 = CONCAT22(in_RDX[2],(undefined2)local_44);
      in_RDI[3] = local_44;
    }
    else {
      local_4c = CONCAT31(local_4c._1_3_,2);
      local_4c = CONCAT22(in_RDX[2],(undefined2)local_4c);
      in_RDI[1] = local_4c;
      local_54 = CONCAT31(local_54._1_3_,2);
      local_54 = CONCAT22(in_RDX[1],(undefined2)local_54);
      in_RDI[3] = local_54;
    }
    local_d8 = 4;
    break;
  case 3:
    for (local_10c = 0; local_110 = local_10c, local_10c < 3; local_10c = local_10c + 1) {
      while (local_110 = local_110 + 1, local_110 < 4) {
        if (in_RDX[local_110] < in_RDX[local_10c]) {
          uVar1 = in_RDX[local_110];
          in_RDX[local_110] = in_RDX[local_10c];
          in_RDX[local_10c] = uVar1;
        }
      }
    }
    local_5c = CONCAT31(local_5c._1_3_,2);
    local_5c = CONCAT22(*in_RDX,(undefined2)local_5c);
    *in_RDI = local_5c;
    local_64 = CONCAT31(local_64._1_3_,2);
    local_64 = CONCAT22(in_RDX[1],(undefined2)local_64);
    in_RDI[2] = local_64;
    local_6c = CONCAT31(local_6c._1_3_,2);
    local_6c = CONCAT22(in_RDX[2],(undefined2)local_6c);
    in_RDI[1] = local_6c;
    local_74 = CONCAT31(local_74._1_3_,2);
    local_74 = CONCAT22(in_RDX[3],(undefined2)local_74);
    in_RDI[3] = local_74;
    local_d8 = 4;
    break;
  case 4:
    if (in_RDX[3] < in_RDX[2]) {
      uVar1 = in_RDX[3];
      in_RDX[3] = in_RDX[2];
      in_RDX[2] = uVar1;
    }
    local_7c = CONCAT31(local_7c._1_3_,1);
    local_7c = CONCAT22(*in_RDX,(undefined2)local_7c);
    *in_RDI = local_7c;
    local_84 = CONCAT31(local_84._1_3_,2);
    local_84 = CONCAT22(in_RDX[1],(undefined2)local_84);
    in_RDI[1] = local_84;
    local_8c = CONCAT31(local_8c._1_3_,1);
    local_8c = CONCAT22(*in_RDX,(undefined2)local_8c);
    in_RDI[2] = local_8c;
    local_94 = CONCAT31(local_94._1_3_,3);
    local_94 = CONCAT22(in_RDX[2],(undefined2)local_94);
    in_RDI[3] = local_94;
    local_9c = CONCAT31(local_9c._1_3_,1);
    local_9c = CONCAT22(*in_RDX,(undefined2)local_9c);
    in_RDI[4] = local_9c;
    local_a4 = CONCAT31(local_a4._1_3_,2);
    local_a4 = CONCAT22(in_RDX[1],(undefined2)local_a4);
    in_RDI[5] = local_a4;
    local_ac = CONCAT31(local_ac._1_3_,1);
    local_ac = CONCAT22(*in_RDX,(undefined2)local_ac);
    in_RDI[6] = local_ac;
    local_b4 = CONCAT31(local_b4._1_3_,3);
    local_b4 = CONCAT22(in_RDX[3],(undefined2)local_b4);
    in_RDI[7] = local_b4;
    local_d8 = 8;
  }
  for (; local_d8 != uVar2; local_d8 = local_d8 << 1) {
    memcpy(in_RDI + local_d8,in_RDI,(ulong)local_d8 << 2);
  }
  return uVar2;
}

Assistant:

uint32_t duckdb_brotli::BrotliBuildSimpleHuffmanTable(HuffmanCode* table,
                                       int root_bits,
                                       uint16_t* val,
                                       uint32_t num_symbols) {
  uint32_t table_size = 1;
  const uint32_t goal_size = 1U << root_bits;
  switch (num_symbols) {
    case 0:
      table[0] = ConstructHuffmanCode(0, val[0]);
      break;
    case 1:
      if (val[1] > val[0]) {
        table[0] = ConstructHuffmanCode(1, val[0]);
        table[1] = ConstructHuffmanCode(1, val[1]);
      } else {
        table[0] = ConstructHuffmanCode(1, val[1]);
        table[1] = ConstructHuffmanCode(1, val[0]);
      }
      table_size = 2;
      break;
    case 2:
      table[0] = ConstructHuffmanCode(1, val[0]);
      table[2] = ConstructHuffmanCode(1, val[0]);
      if (val[2] > val[1]) {
        table[1] = ConstructHuffmanCode(2, val[1]);
        table[3] = ConstructHuffmanCode(2, val[2]);
      } else {
        table[1] = ConstructHuffmanCode(2, val[2]);
        table[3] = ConstructHuffmanCode(2, val[1]);
      }
      table_size = 4;
      break;
    case 3: {
      int i, k;
      for (i = 0; i < 3; ++i) {
        for (k = i + 1; k < 4; ++k) {
          if (val[k] < val[i]) {
            uint16_t t = val[k];
            val[k] = val[i];
            val[i] = t;
          }
        }
      }
      table[0] = ConstructHuffmanCode(2, val[0]);
      table[2] = ConstructHuffmanCode(2, val[1]);
      table[1] = ConstructHuffmanCode(2, val[2]);
      table[3] = ConstructHuffmanCode(2, val[3]);
      table_size = 4;
      break;
    }
    case 4: {
      if (val[3] < val[2]) {
        uint16_t t = val[3];
        val[3] = val[2];
        val[2] = t;
      }
      table[0] = ConstructHuffmanCode(1, val[0]);
      table[1] = ConstructHuffmanCode(2, val[1]);
      table[2] = ConstructHuffmanCode(1, val[0]);
      table[3] = ConstructHuffmanCode(3, val[2]);
      table[4] = ConstructHuffmanCode(1, val[0]);
      table[5] = ConstructHuffmanCode(2, val[1]);
      table[6] = ConstructHuffmanCode(1, val[0]);
      table[7] = ConstructHuffmanCode(3, val[3]);
      table_size = 8;
      break;
    }
  }
  while (table_size != goal_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }
  return goal_size;
}